

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

int emit_table_size(nghttp2_bufs *bufs,size_t table_size)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong len;
  uint8_t sb [16];
  uint8_t local_28 [16];
  
  len = 1;
  if (0x1e < table_size) {
    uVar3 = table_size - 0x1f;
    len = 2;
    if (0x7f < uVar3) {
      do {
        len = len + 1;
        bVar1 = 0x3fff < uVar3;
        uVar3 = uVar3 >> 7;
      } while (bVar1);
    }
  }
  iVar2 = -0x20b;
  if (len < 0x11) {
    local_28[0] = ' ';
    encode_length(local_28,table_size,5);
    iVar2 = nghttp2_bufs_add(bufs,local_28,len);
  }
  return iVar2;
}

Assistant:

static int emit_table_size(nghttp2_bufs *bufs, size_t table_size) {
  int rv;
  uint8_t *bufp;
  size_t blocklen;
  uint8_t sb[16];

  DEBUGF("deflatehd: emit table_size=%zu\n", table_size);

  blocklen = count_encoded_length(table_size, 5);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;

  *bufp = 0x20u;

  encode_length(bufp, table_size, 5);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  return 0;
}